

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O2

void sysbvm_functionBytecodeAssembler_addInstruction
               (sysbvm_functionBytecodeAssembler_t *assembler,sysbvm_tuple_t instruction)

{
  sysbvm_functionBytecodeAssemblerAbstractInstruction_t *psVar1;
  sysbvm_tuple_t sVar2;
  sysbvm_functionBytecodeAssemblerAbstractInstruction_s **ppsVar3;
  
  psVar1 = assembler->lastInstruction;
  *(sysbvm_functionBytecodeAssemblerAbstractInstruction_t **)(instruction + 0x20) = psVar1;
  ppsVar3 = &psVar1->next;
  if (psVar1 == (sysbvm_functionBytecodeAssemblerAbstractInstruction_t *)0x0) {
    ppsVar3 = &assembler->firstInstruction;
  }
  *ppsVar3 = (sysbvm_functionBytecodeAssemblerAbstractInstruction_s *)instruction;
  assembler->lastInstruction = (sysbvm_functionBytecodeAssemblerAbstractInstruction_t *)instruction;
  *(sysbvm_tuple_t *)(instruction + 0x40) = assembler->sourceASTNode;
  sVar2 = assembler->sourceEnvironment;
  *(sysbvm_tuple_t *)(instruction + 0x30) = assembler->sourcePosition;
  *(sysbvm_tuple_t *)(instruction + 0x38) = sVar2;
  return;
}

Assistant:

SYSBVM_API void sysbvm_functionBytecodeAssembler_addInstruction(sysbvm_functionBytecodeAssembler_t *assembler, sysbvm_tuple_t instruction)
{
    sysbvm_functionBytecodeAssemblerAbstractInstruction_t *instructionObject = (sysbvm_functionBytecodeAssemblerAbstractInstruction_t*)instruction;

    instructionObject->previous = assembler->lastInstruction;

    if(assembler->lastInstruction)
    {
        ((sysbvm_functionBytecodeAssemblerAbstractInstruction_t*)assembler->lastInstruction)->next = instructionObject;
    }
    else
    {
        assembler->firstInstruction = instructionObject;
    }

    assembler->lastInstruction = instructionObject;

    instructionObject->sourceASTNode = assembler->sourceASTNode;
    instructionObject->sourceEnvironment = assembler->sourceEnvironment;
    instructionObject->sourcePosition = assembler->sourcePosition;
}